

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O3

void __thiscall LiteScript::State::GarbageCollector(State *this,offset_in_Memory_to_subr caller)

{
  pointer pvVar1;
  pointer pNVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  Variable local_50;
  ulong local_40;
  ulong local_38;
  
  Variable::Variable(&local_50,&this->nsp_global);
  Variable::GarbageCollector(&local_50,caller);
  Variable::~Variable(&local_50);
  uVar3 = ((long)(this->args_tmp).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->args_tmp).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((int)uVar3 != 0) {
    local_40 = uVar3 & 0xffffffff;
    uVar3 = 0;
    do {
      pvVar1 = (this->args_tmp).
               super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)*(pointer *)
                     ((long)&pvVar1[uVar3].
                             super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar1[uVar3].
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data;
      local_38 = uVar3;
      if ((uVar4 & 0xffffffff0) != 0) {
        uVar4 = uVar4 >> 4 & 0xffffffff;
        lVar5 = 0;
        do {
          Variable::Variable(&local_50,
                             (Variable *)
                             (*(long *)&(this->args_tmp).
                                        super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                        ._M_impl.super__Vector_impl_data + lVar5));
          Variable::GarbageCollector(&local_50,caller);
          Variable::~Variable(&local_50);
          lVar5 = lVar5 + 0x10;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar3 = local_38 + 1;
    } while (uVar3 != local_40);
  }
  uVar3 = ((long)(this->args_def).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->args_def).
                 super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if ((int)uVar3 != 0) {
    local_40 = uVar3 & 0xffffffff;
    uVar3 = 0;
    do {
      pvVar1 = (this->args_def).
               super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = (long)*(pointer *)
                     ((long)&pvVar1[uVar3].
                             super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                             ._M_impl.super__Vector_impl_data + 8) -
              *(long *)&pvVar1[uVar3].
                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                        ._M_impl.super__Vector_impl_data;
      local_38 = uVar3;
      if ((uVar4 & 0xffffffff0) != 0) {
        uVar4 = uVar4 >> 4 & 0xffffffff;
        lVar5 = 0;
        do {
          Variable::Variable(&local_50,
                             (Variable *)
                             (*(long *)&(this->args_def).
                                        super__Vector_base<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>,_std::allocator<std::vector<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar3].
                                        super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                        ._M_impl.super__Vector_impl_data + lVar5));
          Variable::GarbageCollector(&local_50,caller);
          Variable::~Variable(&local_50);
          lVar5 = lVar5 + 0x10;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      uVar3 = local_38 + 1;
    } while (uVar3 != local_40);
  }
  uVar3 = (long)(this->ths).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->ths).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar3 & 0x1fffffffe0) != 0) {
    uVar3 = uVar3 >> 5 & 0xffffffff;
    lVar5 = 0;
    do {
      pNVar2 = (this->ths).
               super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (**(char **)(pNVar2->data + lVar5 + 0x18) == '\0') {
        Variable::Variable(&local_50,(Variable *)(pNVar2->data + lVar5));
        Variable::GarbageCollector(&local_50,caller);
        Variable::~Variable(&local_50);
      }
      lVar5 = lVar5 + 0x20;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = (long)(this->rets).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->rets).
                super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if ((uVar3 & 0x1fffffffe0) != 0) {
    uVar3 = uVar3 >> 5 & 0xffffffff;
    lVar5 = 0;
    do {
      pNVar2 = (this->rets).
               super__Vector_base<LiteScript::Nullable<LiteScript::Variable>,_std::allocator<LiteScript::Nullable<LiteScript::Variable>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (**(char **)(pNVar2->data + lVar5 + 0x18) == '\0') {
        Variable::Variable(&local_50,(Variable *)(pNVar2->data + lVar5));
        Variable::GarbageCollector(&local_50,caller);
        Variable::~Variable(&local_50);
      }
      lVar5 = lVar5 + 0x20;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = (long)(this->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->op_lifo).
                super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if ((uVar3 & 0xffffffff0) != 0) {
    uVar3 = uVar3 >> 4 & 0xffffffff;
    lVar5 = 0;
    do {
      Variable::Variable(&local_50,
                         (Variable *)
                         ((long)&((this->op_lifo).
                                  super__Vector_base<LiteScript::Variable,_std::allocator<LiteScript::Variable>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->obj + lVar5));
      Variable::GarbageCollector(&local_50,caller);
      Variable::~Variable(&local_50);
      lVar5 = lVar5 + 0x10;
      uVar3 = uVar3 - 1;
    } while (uVar3 != 0);
  }
  uVar3 = ((long)(this->nsp_lifo).
                 super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->nsp_lifo).
                 super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
  if ((int)uVar3 != 0) {
    lVar5 = 0;
    do {
      Namer::GarbageCollector
                ((Namer *)((((this->nsp_lifo).
                             super__Vector_base<LiteScript::Namer,_std::allocator<LiteScript::Namer>_>
                             ._M_impl.super__Vector_impl_data._M_start)->current).data +
                          lVar5 + -0x10),caller);
      lVar5 = lVar5 + 0x48;
    } while ((uVar3 & 0xffffffff) * 0x48 != lVar5);
  }
  return;
}

Assistant:

void LiteScript::State::GarbageCollector(bool (Memory::*caller)(unsigned int)) const {
    Variable(this->nsp_global).GarbageCollector(caller);
    for (unsigned int i = 0, sz_i = this->args_tmp.size(); i < sz_i; i++) {
        for (unsigned int j = 0, sz_j = this->args_tmp[i].size(); j < sz_j; j++)
            Variable(this->args_tmp[i][j]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->args_def.size(); i < sz_i; i++) {
        for (unsigned int j = 0, sz_j = this->args_def[i].size(); j < sz_j; j++)
            Variable(this->args_def[i][j]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->ths.size(); i < sz_i; i++) {
        if (!this->ths[i].isNull)
            Variable(*this->ths[i]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz_i = this->rets.size(); i < sz_i; i++) {
        if (!this->rets[i].isNull)
            Variable(*this->rets[i]).GarbageCollector(caller);
    }
    for (unsigned int i = 0, sz = this->op_lifo.size(); i < sz; i++)
        Variable(this->op_lifo[i]).GarbageCollector(caller);
    for (unsigned int i = 0, sz = this->nsp_lifo.size(); i < sz; i++)
        this->nsp_lifo[i].GarbageCollector(caller);
}